

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TDeletingArray<FVoxel_*,_FVoxel_*>::~TDeletingArray(TDeletingArray<FVoxel_*,_FVoxel_*> *this)

{
  FVoxel *this_00;
  ulong uVar1;
  
  if ((this->super_TArray<FVoxel_*,_FVoxel_*>).Count != 0) {
    uVar1 = 0;
    do {
      this_00 = (this->super_TArray<FVoxel_*,_FVoxel_*>).Array[uVar1];
      if (this_00 != (FVoxel *)0x0) {
        FVoxel::~FVoxel(this_00);
        operator_delete(this_00,0x158);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->super_TArray<FVoxel_*,_FVoxel_*>).Count);
  }
  TArray<FVoxel_*,_FVoxel_*>::~TArray(&this->super_TArray<FVoxel_*,_FVoxel_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}